

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routes.c
# Opt level: O3

int exec_route(void)

{
  halt_baddata();
}

Assistant:

int exec_route(const char *prefix, struct mg_connection *conn) {
	int i, rc;
	route aux;

	for (i = 0; aux.fn != NULL; i++) {
		aux = route_array[i];
		if ((rc = strcmp(aux.prefix, prefix)) == 0) {
			return aux.fn(conn);
		}
	}

	return 404;
}